

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t cmp_key_wcs(archive_rb_node *n,void *key)

{
  archive *in_RSI;
  archive_mstring *in_RDI;
  wchar_t *p;
  match_file *f;
  wchar_t **in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  archive_mstring_get_wcs(in_RSI,in_RDI,in_stack_ffffffffffffffd8);
  if (in_stack_ffffffffffffffd8 == (wchar_t **)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_4 = wcscmp((wchar_t *)in_stack_ffffffffffffffd8,(wchar_t *)in_RSI);
  }
  return local_4;
}

Assistant:

static int
cmp_key_wcs(const struct archive_rb_node *n, const void *key)
{
	struct match_file *f = (struct match_file *)(uintptr_t)n;
	const wchar_t *p;

	archive_mstring_get_wcs(NULL, &(f->pathname), &p);
	if (p == NULL)
		return (-1);
	return (wcscmp(p, (const wchar_t *)key));
}